

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void testTinySVD_3x3<float>(Matrix33<float> *A)

{
  bool bVar1;
  ostream *poVar2;
  float (*pafVar3) [3];
  int i;
  long lVar4;
  int j;
  long lVar5;
  int cols [3];
  int local_68 [4];
  float local_58 [12];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Verifying SVD for [[",0x14);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]]\n",3);
  verifyTinySVD_3x3<float>(A);
  local_58[8] = A->x[2][2];
  local_58[1] = A->x[1][0];
  local_58[0] = A->x[0][0];
  local_58[3] = A->x[0][1];
  local_58[2] = A->x[2][0];
  local_58[5] = A->x[2][1];
  local_58[4] = A->x[1][1];
  local_58[7] = A->x[1][2];
  local_58[6] = A->x[0][2];
  verifyTinySVD_3x3<float>((Matrix33<float> *)local_58);
  local_68[0] = 0;
  local_68[1] = 1;
  local_68[2] = 2;
  do {
    local_58[0] = 1.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[4] = 1.0;
    local_58[5] = 0.0;
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[8] = 1.0;
    lVar4 = 0;
    pafVar3 = (float (*) [3])local_58;
    do {
      lVar5 = 0;
      do {
        (*(float (*) [3])*pafVar3)[lVar5] = A->x[lVar4][local_68[lVar5]];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar4 = lVar4 + 1;
      pafVar3 = pafVar3 + 1;
    } while (lVar4 != 3);
    verifyTinySVD_3x3<float>((Matrix33<float> *)local_58);
    bVar1 = std::__next_permutation<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_68);
  } while (bVar1);
  return;
}

Assistant:

void
testTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", "
              << A[0][2] << "], "
              << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << "], "
              << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << "]]\n";

    verifyTinySVD_3x3 (A);
    verifyTinySVD_3x3 (A.transposed ());

    // Try all different orderings of the columns of A:
    int cols[3] = {0, 1, 2};
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix33<T> B;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_3x3 (B);
    } while (std::next_permutation (cols, cols + 3));
}